

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::cleanUp(void)

{
  anon_unknown_21::getTheRegistryHub();
  if (anon_unknown_21::getTheRegistryHub::theRegistryHub != (RegistryHub *)0x0) {
    (*(anon_unknown_21::getTheRegistryHub::theRegistryHub->super_IRegistryHub)._vptr_IRegistryHub[1]
    )();
  }
  anon_unknown_21::getTheRegistryHub();
  anon_unknown_21::getTheRegistryHub::theRegistryHub = (RegistryHub *)0x0;
  cleanUpContext();
  return;
}

Assistant:

void cleanUp() {
        delete getTheRegistryHub();
        getTheRegistryHub() = NULL;
        cleanUpContext();
    }